

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O2

void __thiscall
icu_63::VTimeZone::writeZonePropsByTime
          (VTimeZone *this,VTZWriter *writer,UBool isDst,UnicodeString *zonename,int32_t fromOffset,
          int32_t toOffset,UDate time,UBool withRDATE,UErrorCode *status)

{
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  UnicodeString timestr;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    beginZoneProps(this,writer,isDst,zonename,fromOffset,toOffset,time,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      if (withRDATE != '\0') {
        VTZWriter::write(writer,0x37cb36,__buf,(size_t)zonename);
        VTZWriter::write(writer,0x3a,__buf_00,(size_t)zonename);
        timestr.super_Replaceable.super_UObject._vptr_UObject =
             (UObject)&PTR__UnicodeString_00471e80;
        timestr.fUnion.fStackFields.fLengthAndFlags = 2;
        getDateTimeString((double)fromOffset + time,&timestr);
        VTZWriter::write(writer,(int)&timestr,__buf_01,(size_t)zonename);
        VTZWriter::write(writer,0x37cb4e,__buf_02,(size_t)zonename);
        this = (VTimeZone *)&timestr;
        icu_63::UnicodeString::~UnicodeString((UnicodeString *)this);
      }
      endZoneProps(this,writer,isDst,status);
    }
  }
  return;
}

Assistant:

void
VTimeZone::writeZonePropsByTime(VTZWriter& writer, UBool isDst, const UnicodeString& zonename,
                                int32_t fromOffset, int32_t toOffset, UDate time, UBool withRDATE,
                                UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return;
    }
    beginZoneProps(writer, isDst, zonename, fromOffset, toOffset, time, status);
    if (U_FAILURE(status)) {
        return;
    }
    if (withRDATE) {
        writer.write(ICAL_RDATE);
        writer.write(COLON);
        UnicodeString timestr;
        writer.write(getDateTimeString(time + fromOffset, timestr));
        writer.write(ICAL_NEWLINE);
    }
    endZoneProps(writer, isDst, status);
    if (U_FAILURE(status)) {
        return;
    }
}